

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O0

int findpara(void)

{
  bool bVar1;
  ushort **ppuVar2;
  int local_10;
  int nospace;
  int col;
  
  bVar1 = false;
  while( true ) {
    curwp->w_doto = 0;
    for (local_10 = 0; local_10 < curwp->w_dotp->l_used; local_10 = local_10 + 1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)(byte)curwp->w_dotp->l_text[local_10]] & 0x2000) == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) break;
    if (curwp->w_dotp->l_fp == curbp->b_headp) {
      return 0;
    }
    curwp->w_dotp = curwp->w_dotp->l_fp;
    curwp->w_dotline = curwp->w_dotline + 1;
  }
  return 1;
}

Assistant:

int
findpara(void)
{
	int	col, nospace = 0;

	/* we move forward to find a para to mark */
	do {
		curwp->w_doto = 0;
		col = 0;

		/* check if we are on a blank line */
		while (col < llength(curwp->w_dotp)) {
			if (!isspace(lgetc(curwp->w_dotp, col)))
				nospace = 1;
			col++;
		}
		if (nospace)
			break;

		if (lforw(curwp->w_dotp) == curbp->b_headp)
			return (FALSE);

		curwp->w_dotp = lforw(curwp->w_dotp);	
		curwp->w_dotline++;
	} while (1);

	return (TRUE);
}